

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

char * __thiscall
ctemplate::UnsafeArena::Realloc(UnsafeArena *this,char *s,size_t oldsize,size_t newsize)

{
  bool bVar1;
  void *__dest;
  char *pcVar2;
  
  bVar1 = BaseArena::AdjustLastAlloc(&this->super_BaseArena,s,newsize);
  if ((oldsize < newsize) && (!bVar1)) {
    __dest = BaseArena::GetMemory(&this->super_BaseArena,newsize,1);
    pcVar2 = (char *)memcpy(__dest,s,oldsize);
    return pcVar2;
  }
  return s;
}

Assistant:

char* UnsafeArena::Realloc(char* s, size_t oldsize, size_t newsize) {
  assert(oldsize >= 0 && newsize >= 0);
  if ( AdjustLastAlloc(s, newsize) )             // in case s was last alloc
    return s;
  if ( newsize <= oldsize ) {
    return s;  // no need to do anything; we're ain't reclaiming any memory!
  }
  char * newstr = Alloc(newsize);
  memcpy(newstr, s, min(oldsize, newsize));
  return newstr;
}